

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ParseBlock(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  string *psVar4;
  Logger *this_00;
  LineReader *pLVar5;
  float fVar6;
  byte local_c9;
  byte local_b9;
  Block *block;
  Block local_88;
  FileData *local_20;
  FileData *output_local;
  LineReader *reader_local;
  DXFImporter *this_local;
  
  local_88.base.x = 0.0;
  local_88.base.y = 0.0;
  local_88.base.z = 0.0;
  local_88._92_4_ = 0;
  local_88.name.field_2._M_allocated_capacity = 0;
  local_88.name.field_2._8_8_ = 0;
  local_88.name._M_dataplus = (_Alloc_hider)0x0;
  local_88.name._1_7_ = 0;
  local_88.name._M_string_length = 0;
  local_88.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20 = output;
  output_local = (FileData *)reader;
  reader_local = (LineReader *)this;
  DXF::Block::Block(&local_88);
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::push_back
            (&output->blocks,&local_88);
  DXF::Block::~Block(&local_88);
  pvVar3 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                     (&local_20->blocks);
  while( true ) {
    bVar1 = DXF::LineReader::End((LineReader *)output_local);
    local_b9 = 0;
    if (!bVar1) {
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"ENDBLK");
      local_b9 = bVar1 ^ 0xff;
    }
    if ((local_b9 & 1) == 0) break;
    iVar2 = DXF::LineReader::GroupCode((LineReader *)output_local);
    switch(iVar2) {
    case 2:
      psVar4 = DXF::LineReader::Value_abi_cxx11_((LineReader *)output_local);
      std::__cxx11::string::operator=((string *)&pvVar3->name,(string *)psVar4);
      break;
    case 10:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar3->base).x = fVar6;
      break;
    case 0x14:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar3->base).y = fVar6;
      break;
    case 0x1e:
      fVar6 = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      (pvVar3->base).z = fVar6;
    }
    bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"POLYLINE");
    if (bVar1) {
      pLVar5 = DXF::LineReader::operator++((LineReader *)output_local);
      ParsePolyLine(this,pLVar5,local_20);
    }
    else {
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"INSERT");
      if (bVar1) {
        this_00 = DefaultLogger::get();
        Logger::warn(this_00,"DXF: INSERT within a BLOCK not currently supported; skipping");
        while( true ) {
          bVar1 = DXF::LineReader::End((LineReader *)output_local);
          local_c9 = 0;
          if (!bVar1) {
            bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"ENDBLK");
            local_c9 = bVar1 ^ 0xff;
          }
          if ((local_c9 & 1) == 0) break;
          DXF::LineReader::operator++((LineReader *)output_local);
        }
        return;
      }
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"3DFACE");
      if (((bVar1) || (bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"LINE"), bVar1)) ||
         (bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"3DLINE"), bVar1)) {
        pLVar5 = DXF::LineReader::operator++((LineReader *)output_local);
        Parse3DFace(this,pLVar5,local_20);
      }
      else {
        DXF::LineReader::operator++((LineReader *)output_local);
      }
    }
  }
  return;
}

Assistant:

void DXFImporter::ParseBlock(DXF::LineReader& reader, DXF::FileData& output) {
    // push a new block onto the stack.
    output.blocks.push_back( DXF::Block() );
    DXF::Block& block = output.blocks.back();

    while( !reader.End() && !reader.Is(0,"ENDBLK")) {

        switch(reader.GroupCode()) {
            case GroupCode_Name:
                block.name = reader.Value();
                break;

            case GroupCode_XComp:
                block.base.x = reader.ValueAsFloat();
                break;
            case GroupCode_YComp:
                block.base.y = reader.ValueAsFloat();
                break;
            case GroupCode_ZComp:
                block.base.z = reader.ValueAsFloat();
                break;
        }

        if (reader.Is(0,"POLYLINE")) {
            ParsePolyLine(++reader,output);
            continue;
        }

        // XXX is this a valid case?
        if (reader.Is(0,"INSERT")) {
            ASSIMP_LOG_WARN("DXF: INSERT within a BLOCK not currently supported; skipping");
            for( ;!reader.End() && !reader.Is(0,"ENDBLK"); ++reader);
            break;
        }

        else if (reader.Is(0,"3DFACE") || reader.Is(0,"LINE") || reader.Is(0,"3DLINE")) {
            //http://sourceforge.net/tracker/index.php?func=detail&aid=2970566&group_id=226462&atid=1067632
            Parse3DFace(++reader, output);
            continue;
        }
        ++reader;
    }
}